

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

void mbedtls_ssl_config_free(mbedtls_ssl_config *conf)

{
  size_t sVar1;
  mbedtls_ssl_key_cert *pmVar2;
  mbedtls_ssl_key_cert *__ptr;
  long lVar3;
  size_t sVar4;
  uchar *puVar5;
  
  mbedtls_mpi_free(&conf->dhm_P);
  mbedtls_mpi_free(&conf->dhm_G);
  puVar5 = conf->psk;
  if (puVar5 != (uchar *)0x0) {
    sVar1 = conf->psk_len;
    if (sVar1 != 0) {
      sVar4 = 0;
      do {
        puVar5[sVar4] = '\0';
        sVar4 = sVar4 + 1;
      } while (sVar1 != sVar4);
      puVar5 = conf->psk;
    }
    free(puVar5);
    conf->psk = (uchar *)0x0;
    conf->psk_len = 0;
  }
  puVar5 = conf->psk_identity;
  if (puVar5 != (uchar *)0x0) {
    sVar1 = conf->psk_identity_len;
    if (sVar1 != 0) {
      sVar4 = 0;
      do {
        puVar5[sVar4] = '\0';
        sVar4 = sVar4 + 1;
      } while (sVar1 != sVar4);
      puVar5 = conf->psk_identity;
    }
    free(puVar5);
    conf->psk_identity = (uchar *)0x0;
    conf->psk_identity_len = 0;
  }
  __ptr = conf->key_cert;
  while (__ptr != (mbedtls_ssl_key_cert *)0x0) {
    pmVar2 = __ptr->next;
    free(__ptr);
    __ptr = pmVar2;
  }
  lVar3 = 0;
  do {
    *(undefined1 *)((long)conf->ciphersuite_list + lVar3) = 0;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x178);
  return;
}

Assistant:

void mbedtls_ssl_config_free( mbedtls_ssl_config *conf )
{
#if defined(MBEDTLS_DHM_C)
    mbedtls_mpi_free( &conf->dhm_P );
    mbedtls_mpi_free( &conf->dhm_G );
#endif

#if defined(MBEDTLS_KEY_EXCHANGE__SOME__PSK_ENABLED)
    if( conf->psk != NULL )
    {
        mbedtls_zeroize( conf->psk, conf->psk_len );
        mbedtls_free( conf->psk );
        conf->psk = NULL;
        conf->psk_len = 0;
    }

    if( conf->psk_identity != NULL )
    {
        mbedtls_zeroize( conf->psk_identity, conf->psk_identity_len );
        mbedtls_free( conf->psk_identity );
        conf->psk_identity = NULL;
        conf->psk_identity_len = 0;
    }
#endif

#if defined(MBEDTLS_X509_CRT_PARSE_C)
    ssl_key_cert_free( conf->key_cert );
#endif

    mbedtls_zeroize( conf, sizeof( mbedtls_ssl_config ) );
}